

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan.h
# Opt level: O1

Orphan<capnp::Data> * __thiscall
capnp::Orphanage::newOrphanCopy<capnp::Data::Reader>
          (Orphan<capnp::Data> *__return_storage_ptr__,Orphanage *this,Reader copyFrom)

{
  uint64_t local_30;
  SegmentBuilder *local_28;
  CapTableBuilder *local_20;
  word *local_18;
  
  capnp::_::OrphanBuilder::copy((EVP_PKEY_CTX *)&local_30,(EVP_PKEY_CTX *)this->arena);
  (__return_storage_ptr__->builder).segment = local_28;
  (__return_storage_ptr__->builder).capTable = local_20;
  (__return_storage_ptr__->builder).location = local_18;
  (__return_storage_ptr__->builder).tag.content = local_30;
  return __return_storage_ptr__;
}

Assistant:

inline Orphan<FromReader<Reader>> Orphanage::newOrphanCopy(Reader copyFrom) const {
  return Orphan<FromReader<Reader>>(_::OrphanBuilder::copy(
      arena, capTable, GetInnerReader<FromReader<Reader>>::apply(copyFrom)));
}